

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_avx2.c
# Opt level: O0

__m256i * calc_mask_d16_inv_avx2
                    (__m256i *data_src0,__m256i *data_src1,__m256i *round_const,
                    __m256i *mask_base_16,__m256i *clip_diff,int round)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  __m256i *in_R8;
  uint in_R9D;
  __m256i diff_const_16;
  __m256i diff_clamp;
  __m256i diff_mask;
  __m256i diff_factor;
  __m256i diff_round;
  __m256i diff;
  __m256i diffb;
  __m256i diffa;
  
  auVar1 = vpsubusw_avx2(*in_RDI,*in_RSI);
  auVar2 = vpsubusw_avx2(*in_RSI,*in_RDI);
  auVar1 = vpmaxuw_avx2(auVar1,auVar2);
  auVar1 = vpaddusw_avx2(auVar1,*in_RDX);
  auVar1 = vpsrlw_avx2(auVar1,ZEXT416(in_R9D));
  auVar1 = vpsrlw_avx2(auVar1,ZEXT416(4));
  auVar1 = vpaddsw_avx2(auVar1,*in_RCX);
  auVar1 = vpminsw_avx2(auVar1,(undefined1  [32])*in_R8);
  vpsubw_avx2((undefined1  [32])*in_R8,auVar1);
  return in_R8;
}

Assistant:

static inline __m256i calc_mask_d16_inv_avx2(const __m256i *data_src0,
                                             const __m256i *data_src1,
                                             const __m256i *round_const,
                                             const __m256i *mask_base_16,
                                             const __m256i *clip_diff,
                                             int round) {
  const __m256i diffa = _mm256_subs_epu16(*data_src0, *data_src1);
  const __m256i diffb = _mm256_subs_epu16(*data_src1, *data_src0);
  const __m256i diff = _mm256_max_epu16(diffa, diffb);
  const __m256i diff_round =
      _mm256_srli_epi16(_mm256_adds_epu16(diff, *round_const), round);
  const __m256i diff_factor = _mm256_srli_epi16(diff_round, DIFF_FACTOR_LOG2);
  const __m256i diff_mask = _mm256_adds_epi16(diff_factor, *mask_base_16);
  const __m256i diff_clamp = _mm256_min_epi16(diff_mask, *clip_diff);
  const __m256i diff_const_16 = _mm256_sub_epi16(*clip_diff, diff_clamp);
  return diff_const_16;
}